

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

int ribesl(double x,double alpha,int nb,int ize,double *b)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  if (((((nb < 1) || (x < 0.0)) || (alpha < 0.0)) || ((1.0 <= alpha || (709.0 < x && ize == 1)))) ||
     (10000.0 < x && ize == 2)) {
    iVar1 = i4_min(nb,0);
    return iVar1 + -1;
  }
  if (x < 0.0001) {
    dVar18 = 1.0;
    dVar11 = alpha + 1.0;
    dVar16 = (double)(-(ulong)(8.9e-308 < x) & (ulong)(x * 0.5));
    if ((alpha != 0.0) || (NAN(alpha))) {
      dVar18 = pow(dVar16,alpha);
      dVar10 = tgamma(dVar11);
      dVar18 = dVar18 / dVar10;
    }
    if (ize == 2) {
      dVar10 = exp(-x);
      dVar18 = dVar18 * dVar10;
    }
    dVar10 = (double)(-(ulong)(1.0 < x + 1.0) & (ulong)(dVar16 * dVar16));
    dVar12 = (dVar10 * dVar18) / dVar11 + dVar18;
    *b = dVar12;
    iVar1 = 0;
    if (x == 0.0 || dVar12 != 0.0) {
      iVar1 = nb;
    }
    if (nb == 1) {
      return iVar1;
    }
    if ((x == 0.0) && (!NAN(x))) {
      for (uVar3 = 1; uVar3 < (uint)nb; uVar3 = uVar3 + 1) {
        b[uVar3] = 0.0;
      }
      return iVar1;
    }
    for (uVar3 = 2; uVar3 <= (uint)nb; uVar3 = uVar3 + 1) {
      dVar18 = dVar18 / dVar11;
      dVar11 = dVar11 + 1.0;
      dVar18 = dVar18 * dVar16;
      dVar18 = (double)((ulong)dVar18 &
                       -(ulong)((double)(~-(ulong)(dVar10 != 0.0) & (ulong)(1.78e-307 / x) |
                                        (ulong)(8.9e-308 / dVar10) & -(ulong)(dVar10 != 0.0)) *
                                dVar11 < dVar18));
      dVar12 = (dVar10 * dVar18) / dVar11 + dVar18;
      iVar7 = (int)uVar3 + -1;
      if ((long)iVar1 <= (long)uVar3) {
        iVar7 = iVar1;
      }
      if (dVar12 != 0.0) {
        iVar7 = iVar1;
      }
      b[uVar3 - 1] = dVar12;
      if (NAN(dVar12)) {
        iVar7 = iVar1;
      }
      iVar1 = iVar7;
    }
    return iVar1;
  }
  iVar7 = (int)x;
  iVar1 = nb - iVar7;
  dVar11 = alpha + alpha;
  dVar16 = (double)(iVar7 * 2 + 2) + dVar11;
  dVar18 = dVar16 / x;
  if (iVar7 < 0x29) {
    dVar10 = pow(1.585,(double)iVar7);
    dVar10 = 2e+16 / dVar10;
  }
  else {
    dVar10 = dVar18 * 2e+16;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
  }
  if (iVar1 < 3) {
    dVar12 = 1.0;
LAB_0019c4b8:
    iVar2 = 2;
    if (2 < iVar1) {
      iVar2 = iVar1;
    }
    iVar7 = iVar7 + iVar2;
    do {
      iVar1 = iVar7;
      dVar16 = dVar16 + 2.0;
      dVar15 = (dVar16 * dVar18) / x + dVar12;
      iVar7 = iVar1 + 1;
      dVar12 = dVar18;
      dVar18 = dVar15;
      iVar6 = nb;
    } while (dVar15 < dVar10);
  }
  else {
    dVar13 = dVar18;
    dVar12 = 1.0;
    iVar2 = iVar7 + 1;
    do {
      iVar8 = iVar2;
      dVar18 = dVar13;
      if (nb <= iVar8 + 1) {
        dVar13 = dVar12 * 1e+16;
        if (dVar13 < 0.0) {
          dVar13 = sqrt(dVar13);
        }
        else {
          dVar13 = SQRT(dVar13);
        }
        dVar17 = dVar18 + dVar18;
        if (dVar17 < 0.0) {
          dVar17 = sqrt(dVar17);
        }
        else {
          dVar17 = SQRT(dVar17);
        }
        dVar16 = (double)((nb + -1) * 2) + dVar11;
        dVar10 = r8_max(dVar10,dVar13 * dVar17);
        goto LAB_0019c4b8;
      }
      dVar16 = dVar16 + 2.0;
      dVar13 = dVar12 + (dVar16 * dVar18) / x;
      dVar12 = dVar18;
      iVar2 = iVar8 + 1;
    } while (dVar13 <= 1e+292);
    dVar10 = dVar18 / 1e+308;
    dVar12 = dVar13 / 1e+308;
    iVar1 = iVar8;
    do {
      iVar7 = iVar1;
      dVar17 = dVar12;
      dVar14 = dVar10;
      dVar16 = dVar16 + 2.0;
      dVar12 = (dVar16 * dVar17) / x + dVar14;
      iVar1 = iVar7 + 1;
      dVar10 = dVar17;
    } while (dVar12 <= 1.0);
    dVar12 = dVar16 / x;
    dVar15 = dVar17 * 1e+308;
    dVar16 = dVar16 + -2.0;
    iVar2 = i4_min(nb,iVar1);
    iVar7 = iVar7 + 2;
    dVar10 = dVar13 / 1e+308;
    dVar18 = dVar18 / 1e+308;
    do {
      dVar13 = dVar10;
      iVar8 = iVar8 + 1;
      iVar6 = iVar2;
      if (iVar2 <= iVar8) break;
      dVar10 = dVar18 + (dVar16 * dVar13) / x;
      dVar18 = dVar13;
      iVar6 = iVar8;
    } while (dVar13 * dVar10 <= (0.5 - 0.5 / (dVar12 * dVar12)) * ((dVar14 * dVar17) / 1e+16));
  }
  dVar16 = dVar16 + 2.0;
  dVar10 = (double)iVar1;
  dVar15 = 1.0 / dVar15;
  dVar18 = dVar10 + alpha;
  dVar11 = dVar11 + dVar10 + -1.0;
  dVar12 = (dVar18 * dVar15 * dVar11) / dVar10;
  iVar2 = iVar7 - nb;
  if (iVar2 < 0) {
    lVar4 = (long)iVar1;
    b[lVar4] = dVar15;
    for (uVar3 = 1; 1 - iVar2 != uVar3; uVar3 = uVar3 + 1) {
      b[iVar1 + (int)uVar3] = 0.0;
    }
    if (1 < iVar1) {
      for (lVar5 = 0; 1 - iVar1 != (int)lVar5; lVar5 = lVar5 + -1) {
        dVar16 = dVar16 + -2.0;
        dVar13 = (b[lVar4 + lVar5] * dVar16) / x + b[lVar4 + lVar5 + 1];
        b[lVar4 + lVar5 + -1] = dVar13;
        dVar17 = 1.0;
        if (2 - lVar4 != lVar5) {
          dVar17 = dVar11 + -1.0;
        }
        dVar10 = dVar10 + -1.0;
        dVar18 = dVar18 + -1.0;
        dVar12 = ((dVar13 * dVar18 + dVar12) * dVar17) / dVar10;
        dVar11 = dVar17;
      }
    }
    dVar15 = ((dVar18 + dVar18) * b[1]) / x + b[2];
    *b = dVar15;
  }
  else {
    dVar13 = 0.0;
    iVar8 = nb;
    if (iVar2 != 0) {
      iVar1 = (iVar1 - nb) + 1;
      dVar17 = dVar15;
      dVar13 = 0.0;
      while (dVar15 = dVar17, bVar9 = iVar1 != 0, iVar1 = iVar1 + -1, iVar8 = iVar7, bVar9) {
        dVar16 = dVar16 + -2.0;
        dVar17 = dVar13 + (dVar16 * dVar15) / x;
        dVar10 = dVar10 + -1.0;
        dVar13 = dVar15;
        if (iVar7 == 3) {
          dVar11 = 1.0;
        }
        else {
          dVar11 = dVar11 + -1.0;
          if (iVar7 == 2) {
            dVar15 = dVar17;
            iVar8 = 1;
            break;
          }
        }
        dVar18 = dVar18 + -1.0;
        dVar12 = ((dVar17 * dVar18 + dVar12) * dVar11) / dVar10;
        iVar7 = iVar7 + -1;
      }
    }
    lVar4 = (long)iVar8;
    b[lVar4 + -1] = dVar15;
    if (nb == 1) {
      dVar15 = dVar12 + dVar12 + dVar15;
      goto LAB_0019c782;
    }
    dVar16 = dVar16 + -2.0;
    dVar13 = dVar13 + (dVar15 * dVar16) / x;
    b[lVar4 + -2] = dVar13;
    if (iVar8 < 3) {
      dVar15 = *b;
    }
    else {
      dVar10 = dVar10 + -1.0;
      if (iVar8 == 3) {
        dVar11 = 1.0;
      }
      else {
        dVar11 = dVar11 + -1.0;
      }
      dVar18 = dVar18 + -1.0;
      dVar12 = ((dVar13 * dVar18 + dVar12) * dVar11) / dVar10;
      if (iVar8 != 3) {
        for (lVar5 = 0; 3 - iVar8 != (int)lVar5; lVar5 = lVar5 + -1) {
          dVar16 = dVar16 + -2.0;
          dVar13 = (b[lVar4 + lVar5 + -2] * dVar16) / x + b[lVar4 + lVar5 + -1];
          b[lVar4 + lVar5 + -3] = dVar13;
          dVar17 = 1.0;
          if (4 - lVar4 != lVar5) {
            dVar17 = dVar11 + -1.0;
          }
          dVar10 = dVar10 + -1.0;
          dVar18 = dVar18 + -1.0;
          dVar12 = ((dVar13 * dVar18 + dVar12) * dVar17) / dVar10;
          dVar11 = dVar17;
        }
      }
      dVar15 = ((dVar18 + dVar18) * b[1]) / x + b[2];
      *b = dVar15;
    }
  }
  dVar15 = dVar12 + dVar12 + dVar15;
LAB_0019c782:
  if ((alpha != 0.0) || (NAN(alpha))) {
    dVar18 = tgamma(alpha + 1.0);
    dVar11 = pow(x * 0.5,-alpha);
    dVar15 = dVar15 * dVar18 * dVar11;
  }
  if (ize == 1) {
    dVar18 = exp(-x);
    dVar15 = dVar15 * dVar18;
  }
  for (uVar3 = 0; (uint)nb != uVar3; uVar3 = uVar3 + 1) {
    b[uVar3] = (double)(~-(ulong)(b[uVar3] <
                                 (double)(~-(ulong)(1.0 < dVar15) & 0x2fffba634018db |
                                         (ulong)(dVar15 * 8.9e-308) & -(ulong)(1.0 < dVar15))) &
                       (ulong)b[uVar3]) / dVar15;
  }
  return iVar6;
}

Assistant:

int ribesl ( double x, double alpha, int nb, int ize, double b[] )

//****************************************************************************80
//
//  Purpose:
//
//    RIBESL calculates I Bessel function with non-integer orders.
//
//  Discussion:
//
//    This routine calculates Bessel functions I SUB(N+ALPHA) (X)
//    for non-negative argument X, and non-negative order N+ALPHA,
//    with or without exponential scaling.
//
//    This program is based on a program written by David
//    Sookne that computes values of the Bessel functions J or
//    I of real argument and integer order.  Modifications include
//    the restriction of the computation to the I Bessel function
//    of non-negative real argument, the extension of the computation
//    to arbitrary positive order, the inclusion of optional
//    exponential scaling, and the elimination of most underflow.
//
//    In case of an error, NCALC will not equal NB, and not all I's are
//    calculated to the desired accuracy.
//
//    If NCALC < 0:  An argument is out of range. For example,
//    NB <= 0, IZE is not 1 or 2, or IZE = 1 and EXPARG <= ABS(X)
//    In this case, the B-vector is not calculated, and NCALC is
//    set to MIN(NB,0)-1 so that NCALC /= NB.
//
//    If 0 < NCALC < NB, then not all requested function values could
//    be calculated accurately.  This usually occurs because NB is
//    much larger than ABS(X).  In this case, B(N) is calculated
//    to the desired accuracy for N <= NCALC, but precision
//    is lost for NCALC < N <= NB.  If B(N) does not vanish
//    for NCALC < N (because it is too small to be represented),
//    and B(N)/B(NCALC) = 10**(-K), then only the first NSIG-K
//    significant figures of B(N) can be trusted.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 March 2007
//
//  Author:
//
//    Original FORTRAN77 version by William Cody.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Frank Olver, David Sookne,
//    A Note on Backward Recurrence Algorithms,
//    Mathematics of Computation,
//    Volume 26, 1972, pages 941-947.
//
//    David Sookne,
//    Bessel Functions of Real Argument and Integer Order,
//    NBS Journal of Research B,
//    Volume 77B, 1973, pages 125-132.
//
//    William Cody,
//    Algorithm 597:
//    Sequence of Modified Bessel Functions of the First Kind,
//    ACM Transactions of Mathematical Software,
//    Volume 9, Number 2, June 1983, pages 242-245.
//
//  Parameters:
//
//    Input, double X, the argument for which the functions
//    are to be calculated.
//
//    Input, double ALPHA,the fractional part of the order
//    for which the functions are to be calculated.
//    0 <= ALPHA < 1.0.
//
//    Input, int NB, the number of functions to be calculated.
//    The first function calculated is of order ALPHA, and the
//    last is of order (NB - 1 + ALPHA).  1 <= NB.
//
//    Input, int IZE, scaling option.
//    1, unscaled I's are to calculated,
//    2, exponentially scaled I's are to be calculated.
//
//    Output, double B[NB], the values of the functions
//    I(ALPHA,X) through I(NB-1+ALPHA,X), with scaling if requested.
//
//    Output, int RIBESL, the value of NCALC, the error indicator.
//    If NCALC = NB, then all the requested values were calculated
//    to the desired accuracy.
//
//  Local Parameeters:
//
//    BETA, the radix for the floating-point system.
//
//    MINEXP, smallest representable power of BETA.
//
//    MAXEXP, smallest power of BETA that overflows
//
//    IT, number of bits in the mantissa of a working precision variable.
//
//    NSIG, decimal significance desired.  Should be set to
//    INT(LOG10(2)*IT+1).  Setting NSIG lower will result
//    in decreased accuracy while setting NSIG higher will
//    increase CPU time without increasing accuracy.  The
//    truncation error is limited to a relative error of
//    T=.5*10^(-NSIG).
//
//    ENTEN, 10.0^K, where K is the largest integer such that
//    ENTEN is machine-representable in working precision
//
//    ENSIG, 10.0^NSIG
//
//    RTNSIG, 10.0^(-K) for the smallest integer K such that
//    NSIG/4 <= K.
//
//    ENMTEN, smallest ABS(X) such that X/4 does not underflow
//
//    XLARGE, upper limit on the magnitude of X when IZE=2.  Bear
//    in mind that if ABS(X)=N, then at least N iterations
//    of the backward recursion will be executed.  The value
//    of 10.0^4 is used on every machine.
//
//    EXPARG, largest working precision argument that the library
//    EXP routine can handle and upper limit on the
//    magnitude of X when IZE=1; approximately log(BETA^MAXEXP).
//
//    Approximate values for some important machines are:
//
//                        beta       minexp      maxexp       it
//
//  CRAY-1        (S.P.)    2        -8193        8191        48
//  Cyber 180/855
//    under NOS   (S.P.)    2         -975        1070        48
//  IEEE (IBM/XT,
//    SUN, etc.)  (S.P.)    2         -126         128        24
//  IEEE (IBM/XT,
//    SUN, etc.)  (D.P.)    2        -1022        1024        53
//  IBM 3033      (D.P.)   16          -65          63        14
//  VAX           (S.P.)    2         -128         127        24
//  VAX D-Format  (D.P.)    2         -128         127        56
//  VAX G-Format  (D.P.)    2        -1024        1023        53
//
//
//                        NSIG       ENTEN       ENSIG      RTNSIG
//
// CRAY-1        (S.P.)    15       1.0E+2465   1.0E+15     1.0E-4
// Cyber 180/855
//   under NOS   (S.P.)    15       1.0E+322    1.0E+15     1.0E-4
// IEEE (IBM/XT,
//   SUN, etc.)  (S.P.)     8       1.0E+38     1.0E+8      1.0E-2
// IEEE (IBM/XT,
//   SUN, etc.)  (D.P.)    16       1.0D+308    1.0D+16     1.0D-4
// IBM 3033      (D.P.)     5       1.0D+75     1.0D+5      1.0D-2
// VAX           (S.P.)     8       1.0E+38     1.0E+8      1.0E-2
// VAX D-Format  (D.P.)    17       1.0D+38     1.0D+17     1.0D-5
// VAX G-Format  (D.P.)    16       1.0D+307    1.0D+16     1.0D-4
//
//
//                         ENMTEN      XLARGE   EXPARG
//
// CRAY-1        (S.P.)   1.84E-2466   1.0E+4    5677
// Cyber 180/855
//   under NOS   (S.P.)   1.25E-293    1.0E+4     741
// IEEE (IBM/XT,
//   SUN, etc.)  (S.P.)   4.70E-38     1.0E+4      88
// IEEE (IBM/XT,
//   SUN, etc.)  (D.P.)   8.90D-308    1.0D+4     709
// IBM 3033      (D.P.)   2.16D-78     1.0D+4     174
// VAX           (S.P.)   1.17E-38     1.0E+4      88
// VAX D-Format  (D.P.)   1.17D-38     1.0D+4      88
// VAX G-Format  (D.P.)   2.22D-308    1.0D+4     709
//
{
  double constant = 1.585;
  double em;
  double empal;
  double emp2al;
  double en;
  double enmten = 8.9E-308;
  double ensig = 1.0E+16;
  double enten = 1.0E+308;
  double exparg = 709.0;
  bool flag;
  double half = 0.5;
  double halfx;
  int i;
  int k;
  int l;
  int magx;
  int n;
  int nbmx;
  int ncalc;
  int nend;
  int nsig = 16;
  int nstart;
  double one = 1.0;
  double p;
  double plast;
  double pold;
  double psave;
  double psavel;
  double rtnsig = 1.0E-04;
  double tempa;
  double tempb;
  double tempc;
  double test;
  double total;
  double tover;
  double two = 2.0;
  double xlarge = 1.0E+04;
  double zero = 0.0;
//
//  Check for X, NB, OR IZE out of range.
//
  if ( nb <= 0 )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( x < 0.0 )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( alpha < 0.0 )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( 1.0 <= alpha )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( ize == 1 && exparg < x )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }

  if ( ize == 2 && xlarge < x )
  {
    ncalc = i4_min ( nb, 0 ) - 1;
    return ncalc;
  }
//
//  Use 2-term ascending series for small X.
//
  ncalc = nb;
  magx = static_cast< int > (x);
//
//  Initialize the forward sweep, the P-sequence of Olver.
//
  if ( rtnsig <= x )
  {
    nbmx = nb - magx;
    n = magx + 1;
    en = static_cast<double>(n + n ) + ( alpha + alpha );
    plast = one;
    p = en / x;
//
//  Calculate general significance test.
//
    test = ensig + ensig;

    if ( 5 * nsig < 2 * magx )
    {
      test = sqrt ( test * p );
    }
    else
    {
      test = test / pow ( constant, magx );
    }
//
//  Calculate P-sequence until N = NB-1.  Check for possible overflow.
//
    flag = false;

    if ( 3 <= nbmx )
    {
      tover = enten / ensig;
      nstart = magx + 2;
      nend = nb - 1;

      for ( k = nstart; k <= nend; k++ )
      {
        n = k;
        en = en + two;
        pold = plast;
        plast = p;
        p = en * plast / x + pold;
//
//  To avoid overflow, divide P-sequence by TOVER.  Calculate
//  P-sequence until 1 < ABS(P).
//
        if ( tover < p )
        {
          tover = enten;
          p = p / tover;
          plast = plast / tover;
          psave = p;
          psavel = plast;
          nstart = n + 1;

          for ( ; ; )
          {
            n = n + 1;
            en = en + two;
            pold = plast;
            plast = p;
            p = en * plast / x + pold;

            if ( 1.0 < p )
            {
              break;
            }
          }

          tempb = en / x;
//
//  Calculate backward test, and find NCALC, the highest N
//  such that the test is passed.
//
          test = pold * plast / ensig;
          test = test * ( half - half / ( tempb * tempb ) );
          p = plast * tover;
          n = n - 1;
          en = en - two;
          nend = i4_min ( nb, n );

          ncalc = nend + 1;

          for ( l = nstart; l <= nend; l++ )
          {
            pold = psavel;
            psavel = psave;
            psave = en * psavel / x + pold;

            if ( test < psave * psavel )
            {
              ncalc = l;
              break;
            }
          }
          ncalc = ncalc - 1;
          flag = true;
          break;
        }
      }

      if ( !flag )
      {
        n = nend;
        en = static_cast<double>(n + n ) + ( alpha + alpha );
//
//  Calculate special significance test for 2 < NBMX.
//
        test = r8_max ( test, sqrt ( plast * ensig ) * sqrt ( p + p ) );
      }
    }
//
//  Calculate P-sequence until significance test passed.
//
    if ( !flag )
    {
      for ( ; ; )
      {
        n = n + 1;
        en = en + two;
        pold = plast;
        plast = p;
        p = en * plast / x + pold;

        if ( test <= p )
        {
          break;
        }
      }
    }
//
//  Initialize the backward recursion and the normalization sum.
//
    n = n + 1;
    en = en + two;
    tempb = zero;
    tempa = one / p;
    em = static_cast<double>(n ) - one;
    empal = em + alpha;
    emp2al = ( em - one ) + ( alpha + alpha );
    total = tempa * empal * emp2al / em;
    nend = n - nb;
//
//  N < NB, so store B(N) and set higher orders to zero.
//
    if ( nend < 0 )
    {
      b[n-1] = tempa;
      nend = -nend;

      for ( l = 1; l <= nend; l++ )
      {
        b[n+l-1] = zero;
      }

      nend = n - 2;
//
//  Calculate via difference equation and store B(N), until N = 2.
//
      if ( 0 < nend )
      {
        for ( l = 1; l <= nend; l++ )
        {
          n = n - 1;
          en = en - two;
          b[n-1] = ( en * b[n] ) / x + b[n+1];
          em = em - one;
          emp2al = emp2al - one;
          if ( n == 2 )
          {
            emp2al = one;
          }
          empal = empal - one;
          total = ( total + b[n-1] * empal ) * emp2al / em;
        }
      }
//
//  Calculate B(1).
//
      b[0] = two * empal * b[1] / x + b[2];

      total = ( total + total ) + b[0];
    }
//
//  Recur backward via difference equation, calculating (but
//  not storing) B(N), until N = NB.
//
    else
    {
      if ( 0 < nend )
      {
        for ( l = 1; l <= nend; l++ )
        {
          n = n - 1;
          en = en - two;
          tempc = tempb;
          tempb = tempa;
          tempa = ( en * tempb ) / x + tempc;
          em = em - one;
          emp2al = emp2al - one;

          if ( n == 1 )
          {
            break;
          }

          if ( n == 2 )
          {
            emp2al = one;
          }
          empal = empal - one;
          total = ( total + tempa * empal ) * emp2al / em;
        }
      }
//
//  Store B(NB).
//
      b[n-1] = tempa;

      if ( nb <= 1 )
      {
        total = ( total + total ) + tempa;
      }
//
//  Calculate and Store B(NB-1).
//
      else
      {
        n = n - 1;
        en = en - two;
        b[n-1] = ( en * tempa ) / x + tempb;

        if ( 1 < n  )
        {
          em = em - one;
          emp2al = emp2al - one;

          if ( n == 2 )
          {
            emp2al = one;
          }
          empal = empal - one;
          total = ( total + b[n-1] * empal ) * emp2al / em;

          nend = n - 2;
//
//  Calculate via difference equation and store B(N), until N = 2.
//
          if ( 0 < nend )
          {
            for ( l = 1; l <= nend; l++ )
            {
              n = n - 1;
              en = en - two;
              b[n-1] = ( en * b[n] ) / x + b[n+1];
              em = em - one;
              emp2al = emp2al - one;
              if ( n == 2 )
              {
                emp2al = one;
              }
              empal = empal - one;
              total = ( total + b[n-1] * empal ) * emp2al / em;
            }
          }
//
//  Calculate B(1).
//
          b[0] = two * empal * b[1] / x + b[2];
        }
        total = ( total + total ) + b[0];
      }
    }
//
//  Normalize.  Divide all B(N) by TOTAL.
//
    if ( alpha != zero )
    {
       total = total * tgamma ( one + alpha ) * pow ( x * half, -alpha );
    }

    if ( ize == 1 )
    {
      total = total * exp ( -x );
    }

    tempa = enmten;

    if ( 1.0 < total )
    {
      tempa = tempa * total;
    }

    for ( n = 1; n <= nb; n++ )
    {
      if ( b[n-1] < tempa )
      {
        b[n-1] = zero;
      }
      b[n-1] = b[n-1] / total;
    }

    return ncalc;
  }
//
//  Two-term ascending series for small X.
//
  else
  {
    tempa = one;
    empal = one + alpha;
    halfx = zero;

    if ( enmten < x )
    {
      halfx = half * x;
    }

    if ( alpha != zero )
    {
      tempa = pow ( halfx, alpha ) / tgamma ( empal );
    }

    if ( ize == 2 )
    {
      tempa = tempa * exp ( - x );
    }

    tempb = zero;

    if ( one < x + one )
    {
      tempb = halfx * halfx;
    }

    b[0] = tempa + tempa * tempb / empal;

    if ( x != zero && b[0] == zero )
    {
      ncalc = 0;
    }

    if ( 1 < nb )
    {
      if ( x == zero )
      {
        for ( i = 1; i < nb; i++ )
        {
          b[i] = zero;
        }
      }
//
//  Calculate higher-order functions.
//
      else
      {
        tempc = halfx;
        tover = ( enmten + enmten ) / x;

        if ( tempb != zero )
        {
          tover = enmten / tempb;
        }

        for ( n = 2; n <= nb; n++ )
        {
          tempa = tempa / empal;
          empal = empal + one;
          tempa = tempa * tempc;

          if ( tempa <= tover * empal )
          {
            tempa = zero;
          }

          b[n-1] = tempa + tempa * tempb / empal;

          if ( b[n-1] == zero && n < ncalc )
          {
            ncalc = n - 1;
          }
        }
      }
    }
  }

  return ncalc;
}